

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Ses_StoreAddEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char *pSol,
                     int fResLimit)

{
  Ses_TruthEntry_t *pSVar1;
  Ses_TimesEntry_t *pSVar2;
  uint uVar3;
  bool bVar4;
  Ses_TruthEntry_t *__dest;
  Ses_TimesEntry_t *pSVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int fUnsynthImp;
  char *pcVar10;
  int fUnsynthRL;
  ulong uVar11;
  
  pcVar10 = pSol;
  fUnsynthRL = fResLimit;
  if (pSol != (char *)0x0) {
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,pArrTimeProfile,pSol);
  }
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  uVar8 = 0;
  uVar11 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      uVar7 = (uint)uVar8 ^
              *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar6 & 0xf) * 4) *
              (int)pTruth[uVar6];
      uVar8 = (ulong)uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
    uVar8 = (ulong)(uVar7 & 0x3ff);
  }
  pSVar1 = pStore->pEntries[uVar8];
  for (__dest = pSVar1; __dest != (Ses_TruthEntry_t *)0x0; __dest = __dest->next) {
    if (__dest->nVars == nVars) {
      if ((int)uVar3 < 1) goto LAB_002bbf5f;
      uVar6 = 0;
      while (__dest->pTruth[uVar6] == pTruth[uVar6]) {
        uVar6 = uVar6 + 1;
        if (uVar11 == uVar6) goto LAB_002bbf5f;
      }
    }
  }
  __dest = (Ses_TruthEntry_t *)calloc(1,0x38);
  __dest->nVars = nVars;
  if (0 < (int)uVar3) {
    memcpy(__dest,pTruth,uVar11 << 3);
  }
  __dest->next = pSVar1;
  pStore->pEntries[uVar8] = __dest;
LAB_002bbf5f:
  pSVar2 = __dest->head;
  if (pSVar2 != (Ses_TimesEntry_t *)0x0) {
    pSVar5 = pSVar2;
    do {
      if (nVars < 1) {
LAB_002bbff8:
        fUnsynthImp = (int)pcVar10;
        bVar4 = false;
        iVar9 = 0;
        if (pSol != (char *)0x0) goto LAB_002bc00b;
        goto LAB_002bc03b;
      }
      pcVar10 = (char *)0x0;
      while (pArrTimeProfile[(long)pcVar10] == pSVar5->pArrTimeProfile[(long)pcVar10]) {
        pcVar10 = pcVar10 + 1;
        if ((char *)(ulong)(uint)nVars == pcVar10) goto LAB_002bbff8;
      }
      pSVar5 = pSVar5->next;
    } while (pSVar5 != (Ses_TimesEntry_t *)0x0);
  }
  fUnsynthImp = (int)pcVar10;
  pSVar5 = (Ses_TimesEntry_t *)calloc(1,0x38);
  if (0 < nVars) {
    memcpy(pSVar5,pArrTimeProfile,(ulong)(uint)nVars << 2);
  }
  pSVar5->pNetwork = pSol;
  pSVar5->fResLimit = fResLimit;
  pSVar5->next = pSVar2;
  __dest->head = pSVar5;
  pStore->nEntriesCount = pStore->nEntriesCount + 1;
  if (pSol == (char *)0x0) {
    iVar9 = 1;
    bVar4 = true;
LAB_002bc03b:
    if (fResLimit == 0) {
      pStore->nUnsynthesizedImp = pStore->nUnsynthesizedImp + 1;
      pStore->pUnsynthesizedImp[nVars] = pStore->pUnsynthesizedImp[nVars] + 1;
    }
    else {
      pStore->nUnsynthesizedRL = pStore->nUnsynthesizedRL + 1;
      pStore->pUnsynthesizedRL[nVars] = pStore->pUnsynthesizedRL[nVars] + 1;
    }
  }
  else {
    pStore->nValidEntriesCount = pStore->nValidEntriesCount + 1;
    iVar9 = 1;
    bVar4 = true;
LAB_002bc00b:
    if (fResLimit == 0) {
      pStore->nSynthesizedImp = pStore->nSynthesizedImp + 1;
      pStore->pSynthesizedImp[nVars] = pStore->pSynthesizedImp[nVars] + 1;
    }
    else {
      pStore->nSynthesizedRL = pStore->nSynthesizedRL + 1;
      pStore->pSynthesizedRL[nVars] = pStore->pSynthesizedRL[nVars] + 1;
    }
  }
  if ((bVar4) && (pStore->szDBName != (char *)0x0)) {
    Ses_StoreWrite(pStore,pStore->szDBName,nVars,nVars,fUnsynthImp,fUnsynthRL);
  }
  return iVar9;
}

Assistant:

int Ses_StoreAddEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char * pSol, int fResLimit )
{
    int key, fAdded;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    if ( pSol )
        Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pArrTimeProfile, pSol );

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* does truth table already exist? */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTEntry )
    {
        pTEntry = ABC_CALLOC( Ses_TruthEntry_t, 1 );
        Ses_StoreTruthCopy( pTEntry, pTruth, nVars );
        pTEntry->next = pStore->pEntries[key];
        pStore->pEntries[key] = pTEntry;
    }

    /* does arrival time already exist? */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTiEntry )
    {
        pTiEntry = ABC_CALLOC( Ses_TimesEntry_t, 1 );
        Ses_StoreTimesCopy( pTiEntry->pArrTimeProfile, pArrTimeProfile, nVars );
        pTiEntry->pNetwork = pSol;
        pTiEntry->fResLimit = fResLimit;
        pTiEntry->next = pTEntry->head;
        pTEntry->head = pTiEntry;

        /* item has been added */
        fAdded = 1;
        pStore->nEntriesCount++;
        if ( pSol )
            pStore->nValidEntriesCount++;
    }
    else
    {
        //assert( 0 );
        /* item was already present */
        fAdded = 0;
    }

    /* statistics */
    if ( pSol )
    {
        if ( fResLimit )
        {
            pStore->nSynthesizedRL++;
            pStore->pSynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nSynthesizedImp++;
            pStore->pSynthesizedImp[nVars]++;
        }
    }
    else
    {
        if ( fResLimit )
        {
            pStore->nUnsynthesizedRL++;
            pStore->pUnsynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nUnsynthesizedImp++;
            pStore->pUnsynthesizedImp[nVars]++;
        }
    }

    if ( fAdded && pStore->szDBName )
        Ses_StoreWrite( pStore, pStore->szDBName, 1, 0, 0, 0 );

    return fAdded;
}